

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O2

void TxToJSON(CTransaction *tx,uint256 hashBlock,UniValue *entry,Chainstate *active_chainstate,
             CTxUndo *txundo,TxVerbosity verbosity)

{
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  bool bVar1;
  CBlockIndex *pindex;
  string *this;
  long in_FS_OFFSET;
  undefined8 uStack_2d8;
  undefined1 auStack_2c8 [8];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  UniValue local_2b0;
  string local_258 [32];
  UniValue local_238;
  string local_1e0 [32];
  UniValue local_1c0;
  string local_168 [32];
  UniValue local_148;
  string local_f0 [32];
  UniValue local_d0;
  string local_78 [32];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p._0_1_ = 1;
  inline_check_non_fatal<bool>
            ((bool *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp"
             ,0x3c,"TxToJSON","verbosity >= TxVerbosity::SHOW_DETAILS");
  local_58.field_2._M_allocated_capacity = 0;
  local_58.field_2._8_8_ = 0;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  TxToUniv(tx,(uint256 *)&local_58,entry,true,txundo,verbosity);
  bVar1 = base_blob<256U>::IsNull((base_blob<256U> *)&hashBlock);
  if (!bVar1) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock7,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp"
               ,0x45,false);
    std::__cxx11::string::string<std::allocator<char>>
              (local_78,"blockhash",(allocator<char> *)(auStack_2c8 + 7));
    base_blob<256u>::GetHex_abi_cxx11_(&local_58,(base_blob<256u> *)&hashBlock);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_d0,&local_58);
    key._M_string_length = (size_type)active_chainstate;
    key._M_dataplus._M_p = (pointer)uStack_2d8;
    key.field_2 = _auStack_2c8;
    UniValue::pushKV(entry,key,stack0xfffffffffffffd48);
    UniValue::~UniValue(&local_d0);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string(local_78);
    pindex = node::BlockManager::LookupBlockIndex(active_chainstate->m_blockman,&hashBlock);
    if (pindex != (CBlockIndex *)0x0) {
      bVar1 = CChain::Contains(&active_chainstate->m_chain,pindex);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_f0,"confirmations",(allocator<char> *)(auStack_2c8 + 7));
        local_58._M_dataplus._M_p._0_4_ =
             (int)((ulong)((long)(active_chainstate->m_chain).vChain.
                                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(active_chainstate->m_chain).vChain.
                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3) - pindex->nHeight;
        UniValue::UniValue<int,_int,_true>(&local_148,(int *)&local_58);
        key_00._M_string_length = (size_type)active_chainstate;
        key_00._M_dataplus._M_p = (pointer)uStack_2d8;
        key_00.field_2 = _auStack_2c8;
        UniValue::pushKV(entry,key_00,stack0xfffffffffffffd48);
        UniValue::~UniValue(&local_148);
        std::__cxx11::string::~string(local_f0);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_168,"time",(allocator<char> *)(auStack_2c8 + 7));
        local_58._M_dataplus._M_p = (pointer)(ulong)pindex->nTime;
        UniValue::UniValue<long,_long,_true>(&local_1c0,(long *)&local_58);
        key_01._M_string_length = (size_type)active_chainstate;
        key_01._M_dataplus._M_p = (pointer)uStack_2d8;
        key_01.field_2 = _auStack_2c8;
        UniValue::pushKV(entry,key_01,stack0xfffffffffffffd48);
        UniValue::~UniValue(&local_1c0);
        std::__cxx11::string::~string(local_168);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1e0,"blocktime",(allocator<char> *)(auStack_2c8 + 7));
        local_58._M_dataplus._M_p = (pointer)(ulong)pindex->nTime;
        UniValue::UniValue<long,_long,_true>(&local_238,(long *)&local_58);
        key_02._M_string_length = (size_type)active_chainstate;
        key_02._M_dataplus._M_p = (pointer)uStack_2d8;
        key_02.field_2 = _auStack_2c8;
        UniValue::pushKV(entry,key_02,stack0xfffffffffffffd48);
        UniValue::~UniValue(&local_238);
        this = local_1e0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_258,"confirmations",(allocator<char> *)(auStack_2c8 + 7));
        local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffff00000000;
        UniValue::UniValue<int,_int,_true>(&local_2b0,(int *)&local_58);
        key_03._M_string_length = (size_type)active_chainstate;
        key_03._M_dataplus._M_p = (pointer)uStack_2d8;
        key_03.field_2 = _auStack_2c8;
        UniValue::pushKV(entry,key_03,stack0xfffffffffffffd48);
        UniValue::~UniValue(&local_2b0);
        this = local_258;
      }
      std::__cxx11::string::~string(this);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TxToJSON(const CTransaction& tx, const uint256 hashBlock, UniValue& entry,
                     Chainstate& active_chainstate, const CTxUndo* txundo = nullptr,
                     TxVerbosity verbosity = TxVerbosity::SHOW_DETAILS)
{
    CHECK_NONFATAL(verbosity >= TxVerbosity::SHOW_DETAILS);
    // Call into TxToUniv() in bitcoin-common to decode the transaction hex.
    //
    // Blockchain contextual information (confirmations and blocktime) is not
    // available to code in bitcoin-common, so we query them here and push the
    // data into the returned UniValue.
    TxToUniv(tx, /*block_hash=*/uint256(), entry, /*include_hex=*/true, txundo, verbosity);

    if (!hashBlock.IsNull()) {
        LOCK(cs_main);

        entry.pushKV("blockhash", hashBlock.GetHex());
        const CBlockIndex* pindex = active_chainstate.m_blockman.LookupBlockIndex(hashBlock);
        if (pindex) {
            if (active_chainstate.m_chain.Contains(pindex)) {
                entry.pushKV("confirmations", 1 + active_chainstate.m_chain.Height() - pindex->nHeight);
                entry.pushKV("time", pindex->GetBlockTime());
                entry.pushKV("blocktime", pindex->GetBlockTime());
            }
            else
                entry.pushKV("confirmations", 0);
        }
    }
}